

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int quantize_segment_mix(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 *puVar4;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  uint32_t size;
  uint32_t i;
  ulong uVar5;
  uint32_t i_1;
  ulong uVar6;
  float fVar7;
  uint32_t samples;
  float *in;
  float *local_38;
  
  puVar4 = (undefined8 *)segment->data;
  fVar1 = *(float *)(puVar4 + 2);
  fVar2 = *(float *)((long)puVar4 + 0x14);
  samples = 0xffffffff;
  buffer = (mixed_buffer *)*puVar4;
  buffer_00 = (mixed_buffer *)puVar4[1];
  mixed_buffer_request_read(&in,&samples,buffer);
  if (buffer == buffer_00) {
    uVar5 = (ulong)samples;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      fVar3 = in[uVar6];
      fVar7 = floorf(fVar1 * fVar3);
      in[uVar6] = fVar3 * (1.0 - fVar2) + (fVar7 / fVar1) * fVar2;
    }
  }
  else {
    mixed_buffer_request_write(&local_38,&samples,buffer_00);
    size = samples;
    uVar6 = (ulong)samples;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      fVar3 = in[uVar5];
      fVar7 = floorf(fVar1 * fVar3);
      local_38[uVar5] = fVar3 * (1.0 - fVar2) + (fVar7 / fVar1) * fVar2;
    }
    mixed_buffer_finish_read(size,buffer);
    mixed_buffer_finish_write(samples,buffer_00);
  }
  return 1;
}

Assistant:

VECTORIZE int quantize_segment_mix(struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;

  float steps = data->steps;
  float mix = data->mix;
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float s = in[i];
      float o = floor(s * steps) / steps;
      out[i] = LERP(s, o, mix);
    });
  return 1;
}